

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  RTCRayQueryContext *pRVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  byte bVar18;
  int iVar19;
  AABBNodeMB4D *node1;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong unaff_R12;
  size_t mask;
  uint uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined4 uVar63;
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2661;
  ulong local_2660;
  long local_2658;
  ulong local_2650;
  ulong local_2648;
  ulong local_2640;
  RayHit *local_2638;
  RayQueryContext *local_2630;
  float local_2628;
  int local_2624;
  ulong local_2620;
  ulong *local_2618;
  ulong local_2610;
  ulong local_2608;
  ulong local_2600;
  long local_25f8;
  long local_25f0;
  RTCFilterFunctionNArguments local_25e8;
  float local_25b8;
  float local_25b4;
  float local_25b0;
  undefined4 local_25ac;
  undefined4 local_25a8;
  undefined4 local_25a4;
  uint local_25a0;
  uint local_259c;
  uint local_2598;
  undefined1 local_2588 [16];
  undefined1 local_2578 [32];
  undefined1 local_2558 [32];
  undefined1 local_2538 [32];
  undefined1 local_2518 [32];
  undefined1 local_24f8 [32];
  undefined1 local_24d8 [16];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 *local_24a8;
  byte local_24a0;
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [16];
  float local_2448 [4];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  float fVar2;
  float fVar3;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar6 = (ray->super_RayK<1>).dir.field_0;
      auVar53 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar52 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar32 = vandps_avx512vl((undefined1  [16])aVar6,auVar32);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      uVar24 = vcmpps_avx512vl(auVar32,auVar33,1);
      auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar80 = ZEXT1664(auVar32);
      auVar32 = vdivps_avx512vl(auVar32,(undefined1  [16])aVar6);
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar11 = (bool)((byte)uVar24 & 1);
      auVar40._0_4_ = (uint)bVar11 * auVar33._0_4_ | (uint)!bVar11 * auVar32._0_4_;
      bVar11 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar11 * auVar33._4_4_ | (uint)!bVar11 * auVar32._4_4_;
      bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar11 * auVar33._8_4_ | (uint)!bVar11 * auVar32._8_4_;
      bVar11 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar11 * auVar33._12_4_ | (uint)!bVar11 * auVar32._12_4_;
      auVar34._8_4_ = 0x3f7ffffa;
      auVar34._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar34._12_4_ = 0x3f7ffffa;
      auVar34 = vmulps_avx512vl(auVar40,auVar34);
      auVar35._8_4_ = 0x3f800003;
      auVar35._0_8_ = 0x3f8000033f800003;
      auVar35._12_4_ = 0x3f800003;
      auVar35 = vmulps_avx512vl(auVar40,auVar35);
      local_24f8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
      auVar81 = ZEXT3264(local_24f8);
      local_2518 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
      auVar82 = ZEXT3264(local_2518);
      puVar26 = local_2368;
      local_2538 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
      auVar83 = ZEXT3264(local_2538);
      local_2558 = vbroadcastss_avx512vl(auVar34);
      auVar84 = ZEXT3264(local_2558);
      auVar32 = vmovshdup_avx(auVar34);
      local_2578 = vbroadcastsd_avx512vl(auVar32);
      auVar85 = ZEXT3264(local_2578);
      auVar33 = vshufpd_avx(auVar34,auVar34,1);
      auVar54._8_4_ = 2;
      auVar54._0_8_ = 0x200000002;
      auVar54._12_4_ = 2;
      auVar54._16_4_ = 2;
      auVar54._20_4_ = 2;
      auVar54._24_4_ = 2;
      auVar54._28_4_ = 2;
      local_23b8 = vpermps_avx2(auVar54,ZEXT1632(auVar34));
      auVar71 = ZEXT3264(local_23b8);
      uVar63 = auVar35._0_4_;
      local_23d8._4_4_ = uVar63;
      local_23d8._0_4_ = uVar63;
      local_23d8._8_4_ = uVar63;
      local_23d8._12_4_ = uVar63;
      local_23d8._16_4_ = uVar63;
      local_23d8._20_4_ = uVar63;
      local_23d8._24_4_ = uVar63;
      local_23d8._28_4_ = uVar63;
      auVar72 = ZEXT3264(local_23d8);
      auVar62._8_4_ = 1;
      auVar62._0_8_ = 0x100000001;
      auVar62._12_4_ = 1;
      auVar62._16_4_ = 1;
      auVar62._20_4_ = 1;
      auVar62._24_4_ = 1;
      auVar62._28_4_ = 1;
      local_23f8 = vpermps_avx2(auVar62,ZEXT1632(auVar35));
      auVar74 = ZEXT3264(local_23f8);
      local_2418 = vpermps_avx2(auVar54,ZEXT1632(auVar35));
      auVar75 = ZEXT3264(local_2418);
      uVar27 = (ulong)(auVar34._0_4_ < 0.0) << 5;
      uVar28 = (ulong)(auVar32._0_4_ < 0.0) << 5 | 0x40;
      uVar29 = (ulong)(auVar33._0_4_ < 0.0) << 5 | 0x80;
      uVar25 = uVar27 ^ 0x20;
      uVar63 = auVar53._0_4_;
      local_2438._4_4_ = uVar63;
      local_2438._0_4_ = uVar63;
      local_2438._8_4_ = uVar63;
      local_2438._12_4_ = uVar63;
      local_2438._16_4_ = uVar63;
      local_2438._20_4_ = uVar63;
      local_2438._24_4_ = uVar63;
      local_2438._28_4_ = uVar63;
      auVar76 = ZEXT3264(local_2438);
      uVar63 = auVar52._0_4_;
      auVar64 = ZEXT3264(CONCAT428(uVar63,CONCAT424(uVar63,CONCAT420(uVar63,CONCAT416(uVar63,
                                                  CONCAT412(uVar63,CONCAT48(uVar63,CONCAT44(uVar63,
                                                  uVar63))))))));
      auVar62 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar78 = ZEXT3264(auVar62);
      auVar79 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      local_2608 = uVar28 ^ 0x20;
      local_2610 = uVar29 ^ 0x20;
      uVar24 = uVar28 ^ 0x20;
      uVar21 = uVar29 ^ 0x20;
      local_2660 = uVar25;
      local_2650 = uVar29;
      local_2648 = uVar28;
      local_2640 = uVar27;
      local_2638 = ray;
      local_2630 = context;
      do {
        do {
          do {
            if (puVar26 == &local_2378) {
              return;
            }
            pfVar4 = (float *)(puVar26 + -1);
            puVar26 = puVar26 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar4);
          uVar31 = *puVar26;
          do {
            auVar62 = auVar76._0_32_;
            if ((uVar31 & 8) == 0) {
              uVar20 = uVar31 & 0xfffffffffffffff0;
              uVar63 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar65._4_4_ = uVar63;
              auVar65._0_4_ = uVar63;
              auVar65._8_4_ = uVar63;
              auVar65._12_4_ = uVar63;
              auVar65._16_4_ = uVar63;
              auVar65._20_4_ = uVar63;
              auVar65._24_4_ = uVar63;
              auVar65._28_4_ = uVar63;
              auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar20 + 0x100 + uVar27),auVar65,
                                        *(undefined1 (*) [32])(uVar20 + 0x40 + uVar27));
              auVar54 = vsubps_avx512vl(ZEXT1632(auVar53),auVar81._0_32_);
              auVar54 = vmulps_avx512vl(auVar84._0_32_,auVar54);
              auVar54 = vmaxps_avx(auVar62,auVar54);
              auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar20 + 0x100 + uVar28),auVar65,
                                        *(undefined1 (*) [32])(uVar20 + 0x40 + uVar28));
              auVar55 = vsubps_avx512vl(ZEXT1632(auVar53),auVar82._0_32_);
              auVar56 = vmulps_avx512vl(auVar85._0_32_,auVar55);
              auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar20 + 0x100 + uVar29),auVar65,
                                        *(undefined1 (*) [32])(uVar20 + 0x40 + uVar29));
              auVar57 = vsubps_avx512vl(ZEXT1632(auVar53),auVar83._0_32_);
              auVar55._4_4_ = auVar71._4_4_ * auVar57._4_4_;
              auVar55._0_4_ = auVar71._0_4_ * auVar57._0_4_;
              auVar55._8_4_ = auVar71._8_4_ * auVar57._8_4_;
              auVar55._12_4_ = auVar71._12_4_ * auVar57._12_4_;
              auVar55._16_4_ = auVar71._16_4_ * auVar57._16_4_;
              auVar55._20_4_ = auVar71._20_4_ * auVar57._20_4_;
              auVar55._24_4_ = auVar71._24_4_ * auVar57._24_4_;
              auVar55._28_4_ = auVar57._28_4_;
              auVar55 = vmaxps_avx(auVar56,auVar55);
              auVar58 = vmaxps_avx512vl(auVar54,auVar55);
              in_ZMM16 = ZEXT3264(auVar58);
              auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar20 + 0x100 + uVar25),auVar65,
                                        *(undefined1 (*) [32])(uVar20 + 0x40 + uVar25));
              auVar54 = vsubps_avx512vl(ZEXT1632(auVar53),auVar81._0_32_);
              auVar56._4_4_ = auVar72._4_4_ * auVar54._4_4_;
              auVar56._0_4_ = auVar72._0_4_ * auVar54._0_4_;
              auVar56._8_4_ = auVar72._8_4_ * auVar54._8_4_;
              auVar56._12_4_ = auVar72._12_4_ * auVar54._12_4_;
              auVar56._16_4_ = auVar72._16_4_ * auVar54._16_4_;
              auVar56._20_4_ = auVar72._20_4_ * auVar54._20_4_;
              auVar56._24_4_ = auVar72._24_4_ * auVar54._24_4_;
              auVar56._28_4_ = auVar54._28_4_;
              auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar20 + 0x100 + uVar24),auVar65,
                                        *(undefined1 (*) [32])(uVar20 + 0x40 + uVar24));
              auVar54 = vsubps_avx512vl(ZEXT1632(auVar53),auVar82._0_32_);
              auVar57._4_4_ = auVar74._4_4_ * auVar54._4_4_;
              auVar57._0_4_ = auVar74._0_4_ * auVar54._0_4_;
              auVar57._8_4_ = auVar74._8_4_ * auVar54._8_4_;
              auVar57._12_4_ = auVar74._12_4_ * auVar54._12_4_;
              auVar57._16_4_ = auVar74._16_4_ * auVar54._16_4_;
              auVar57._20_4_ = auVar74._20_4_ * auVar54._20_4_;
              auVar57._24_4_ = auVar74._24_4_ * auVar54._24_4_;
              auVar57._28_4_ = auVar54._28_4_;
              auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar20 + 0x100 + uVar21),auVar65,
                                        *(undefined1 (*) [32])(uVar20 + 0x40 + uVar21));
              auVar54 = vsubps_avx512vl(ZEXT1632(auVar53),auVar83._0_32_);
              auVar77._4_4_ = auVar75._4_4_ * auVar54._4_4_;
              auVar77._0_4_ = auVar75._0_4_ * auVar54._0_4_;
              auVar77._8_4_ = auVar75._8_4_ * auVar54._8_4_;
              auVar77._12_4_ = auVar75._12_4_ * auVar54._12_4_;
              auVar77._16_4_ = auVar75._16_4_ * auVar54._16_4_;
              auVar77._20_4_ = auVar75._20_4_ * auVar54._20_4_;
              auVar77._24_4_ = auVar75._24_4_ * auVar54._24_4_;
              auVar77._28_4_ = auVar54._28_4_;
              auVar54 = vminps_avx(auVar57,auVar77);
              auVar55 = vminps_avx(auVar64._0_32_,auVar56);
              auVar54 = vminps_avx(auVar55,auVar54);
              if (((uint)uVar31 & 7) == 6) {
                uVar15 = vcmpps_avx512vl(auVar58,auVar54,2);
                uVar13 = vcmpps_avx512vl(auVar65,*(undefined1 (*) [32])(uVar20 + 0x1c0),0xd);
                uVar14 = vcmpps_avx512vl(auVar65,*(undefined1 (*) [32])(uVar20 + 0x1e0),1);
                bVar18 = (byte)uVar15 & (byte)uVar13 & (byte)uVar14;
              }
              else {
                uVar15 = vcmpps_avx512vl(auVar58,auVar54,2);
                bVar18 = (byte)uVar15;
              }
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)bVar18);
            }
            if ((uVar31 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar19 = 4;
              }
              else {
                auVar54 = *(undefined1 (*) [32])(uVar31 & 0xfffffffffffffff0);
                auVar55 = ((undefined1 (*) [32])(uVar31 & 0xfffffffffffffff0))[1];
                auVar77 = auVar78._0_32_;
                auVar65 = auVar79._0_32_;
                auVar61 = in_ZMM16._0_32_;
                auVar56 = vpternlogd_avx512vl(auVar77,auVar61,auVar65,0xf8);
                uVar31 = unaff_R12 & 0xffffffff;
                auVar57 = vpcompressd_avx512vl(auVar56);
                bVar11 = (bool)((byte)uVar31 & 1);
                auVar58._0_4_ = (uint)bVar11 * auVar57._0_4_ | (uint)!bVar11 * auVar56._0_4_;
                bVar11 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar58._4_4_ = (uint)bVar11 * auVar57._4_4_ | (uint)!bVar11 * auVar56._4_4_;
                bVar11 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar58._8_4_ = (uint)bVar11 * auVar57._8_4_ | (uint)!bVar11 * auVar56._8_4_;
                bVar11 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar58._12_4_ = (uint)bVar11 * auVar57._12_4_ | (uint)!bVar11 * auVar56._12_4_;
                bVar11 = (bool)((byte)(uVar31 >> 4) & 1);
                auVar58._16_4_ = (uint)bVar11 * auVar57._16_4_ | (uint)!bVar11 * auVar56._16_4_;
                bVar11 = (bool)((byte)(uVar31 >> 5) & 1);
                auVar58._20_4_ = (uint)bVar11 * auVar57._20_4_ | (uint)!bVar11 * auVar56._20_4_;
                bVar11 = (bool)((byte)(uVar31 >> 6) & 1);
                auVar58._24_4_ = (uint)bVar11 * auVar57._24_4_ | (uint)!bVar11 * auVar56._24_4_;
                bVar11 = (bool)((byte)(uVar31 >> 7) & 1);
                auVar58._28_4_ = (uint)bVar11 * auVar57._28_4_ | (uint)!bVar11 * auVar56._28_4_;
                auVar56 = vpermt2q_avx512vl(auVar54,auVar58,auVar55);
                uVar31 = auVar56._0_8_;
                iVar19 = 0;
                uVar20 = unaff_R12 - 1 & unaff_R12;
                if (uVar20 != 0) {
                  auVar56 = vpshufd_avx2(auVar58,0x55);
                  vpermt2q_avx512vl(auVar54,auVar56,auVar55);
                  auVar57 = vpminsd_avx2(auVar58,auVar56);
                  auVar56 = vpmaxsd_avx2(auVar58,auVar56);
                  uVar20 = uVar20 - 1 & uVar20;
                  uVar25 = local_2660;
                  if (uVar20 == 0) {
                    auVar62 = vpermi2q_avx512vl(auVar57,auVar54,auVar55);
                    uVar31 = auVar62._0_8_;
                    auVar62 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
                    *puVar26 = auVar62._0_8_;
                    auVar62 = vpermd_avx512vl(auVar56,auVar61);
                    *(int *)(puVar26 + 1) = auVar62._0_4_;
                    puVar26 = puVar26 + 2;
                  }
                  else {
                    auVar12 = vpshufd_avx2(auVar58,0xaa);
                    vpermt2q_avx512vl(auVar54,auVar12,auVar55);
                    auVar67 = vpminsd_avx2(auVar57,auVar12);
                    auVar57 = vpmaxsd_avx2(auVar57,auVar12);
                    auVar12 = vpminsd_avx2(auVar56,auVar57);
                    auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                    uVar20 = uVar20 - 1 & uVar20;
                    if (uVar20 == 0) {
                      auVar62 = vpermi2q_avx512vl(auVar67,auVar54,auVar55);
                      uVar31 = auVar62._0_8_;
                      auVar62 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
                      *puVar26 = auVar62._0_8_;
                      auVar62 = vpermd_avx512vl(auVar56,auVar61);
                      *(int *)(puVar26 + 1) = auVar62._0_4_;
                      auVar62 = vpermt2q_avx512vl(auVar54,auVar12,auVar55);
                      puVar26[2] = auVar62._0_8_;
                      auVar62 = vpermd_avx512vl(auVar12,auVar61);
                      *(int *)(puVar26 + 3) = auVar62._0_4_;
                      puVar26 = puVar26 + 4;
                    }
                    else {
                      auVar59 = vmovdqa64_avx512vl(auVar61);
                      auVar57 = vpshufd_avx2(auVar58,0xff);
                      vpermt2q_avx512vl(auVar54,auVar57,auVar55);
                      auVar61 = vpminsd_avx2(auVar67,auVar57);
                      auVar57 = vpmaxsd_avx2(auVar67,auVar57);
                      auVar67 = vpminsd_avx2(auVar12,auVar57);
                      auVar57 = vpmaxsd_avx2(auVar12,auVar57);
                      auVar12 = vpminsd_avx2(auVar56,auVar57);
                      auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                      uVar20 = uVar20 - 1 & uVar20;
                      context = local_2630;
                      ray = local_2638;
                      uVar27 = local_2640;
                      uVar28 = local_2648;
                      uVar29 = local_2650;
                      if (uVar20 == 0) {
                        auVar57 = vpermi2q_avx512vl(auVar61,auVar54,auVar55);
                        uVar31 = auVar57._0_8_;
                        auVar57 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
                        *puVar26 = auVar57._0_8_;
                        auVar57 = vmovdqa64_avx512vl(auVar59);
                        in_ZMM16 = ZEXT3264(auVar57);
                        auVar56 = vpermd_avx512vl(auVar56,auVar59);
                        *(int *)(puVar26 + 1) = auVar56._0_4_;
                        auVar56 = vpermt2q_avx512vl(auVar54,auVar12,auVar55);
                        puVar26[2] = auVar56._0_8_;
                        auVar56 = vpermd_avx512vl(auVar12,auVar59);
                        *(int *)(puVar26 + 3) = auVar56._0_4_;
                        auVar54 = vpermt2q_avx512vl(auVar54,auVar67,auVar55);
                        puVar26[4] = auVar54._0_8_;
                        auVar54 = vpermd_avx512vl(auVar67,auVar59);
                        *(int *)(puVar26 + 5) = auVar54._0_4_;
                        puVar26 = puVar26 + 6;
                        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar80 = ZEXT1664(auVar53);
                        auVar81 = ZEXT3264(local_24f8);
                        auVar82 = ZEXT3264(local_2518);
                        auVar83 = ZEXT3264(local_2538);
                        auVar84 = ZEXT3264(local_2558);
                        auVar85 = ZEXT3264(local_2578);
                        auVar71 = ZEXT3264(auVar71._0_32_);
                        auVar72 = ZEXT3264(auVar72._0_32_);
                        auVar74 = ZEXT3264(auVar74._0_32_);
                        auVar75 = ZEXT3264(auVar75._0_32_);
                        auVar76 = ZEXT3264(auVar62);
                        auVar78 = ZEXT3264(auVar77);
                        auVar79 = ZEXT3264(auVar65);
                      }
                      else {
                        auVar60 = valignd_avx512vl(auVar58,auVar58,3);
                        auVar57 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                        auVar58 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar57,auVar61);
                        auVar57 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar58 = vpermt2d_avx512vl(auVar58,auVar57,auVar67);
                        auVar58 = vpermt2d_avx512vl(auVar58,auVar57,auVar12);
                        auVar57 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar56 = vpermt2d_avx512vl(auVar58,auVar57,auVar56);
                        auVar76 = ZEXT3264(auVar56);
                        uVar31 = uVar20;
                        do {
                          auVar57 = auVar76._0_32_;
                          auVar67._8_4_ = 1;
                          auVar67._0_8_ = 0x100000001;
                          auVar67._12_4_ = 1;
                          auVar67._16_4_ = 1;
                          auVar67._20_4_ = 1;
                          auVar67._24_4_ = 1;
                          auVar67._28_4_ = 1;
                          auVar56 = vpermd_avx2(auVar67,auVar60);
                          auVar60 = valignd_avx512vl(auVar60,auVar60,1);
                          vpermt2q_avx512vl(auVar54,auVar60,auVar55);
                          uVar31 = uVar31 - 1 & uVar31;
                          uVar15 = vpcmpd_avx512vl(auVar56,auVar57,5);
                          auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                          bVar18 = (byte)uVar15 << 1;
                          auVar57 = valignd_avx512vl(auVar57,auVar57,7);
                          bVar11 = (bool)((byte)uVar15 & 1);
                          auVar61._4_4_ =
                               (uint)bVar11 * auVar57._4_4_ | (uint)!bVar11 * auVar56._4_4_;
                          auVar61._0_4_ = auVar56._0_4_;
                          bVar11 = (bool)(bVar18 >> 2 & 1);
                          auVar61._8_4_ =
                               (uint)bVar11 * auVar57._8_4_ | (uint)!bVar11 * auVar56._8_4_;
                          bVar11 = (bool)(bVar18 >> 3 & 1);
                          auVar61._12_4_ =
                               (uint)bVar11 * auVar57._12_4_ | (uint)!bVar11 * auVar56._12_4_;
                          bVar11 = (bool)(bVar18 >> 4 & 1);
                          auVar61._16_4_ =
                               (uint)bVar11 * auVar57._16_4_ | (uint)!bVar11 * auVar56._16_4_;
                          bVar11 = (bool)(bVar18 >> 5 & 1);
                          auVar61._20_4_ =
                               (uint)bVar11 * auVar57._20_4_ | (uint)!bVar11 * auVar56._20_4_;
                          bVar11 = (bool)(bVar18 >> 6 & 1);
                          auVar61._24_4_ =
                               (uint)bVar11 * auVar57._24_4_ | (uint)!bVar11 * auVar56._24_4_;
                          auVar61._28_4_ =
                               (uint)(bVar18 >> 7) * auVar57._28_4_ |
                               (uint)!(bool)(bVar18 >> 7) * auVar56._28_4_;
                          auVar76 = ZEXT3264(auVar61);
                        } while (uVar31 != 0);
                        lVar23 = POPCOUNT(uVar20) + 3;
                        do {
                          auVar56 = vpermi2q_avx512vl(auVar61,auVar54,auVar55);
                          *puVar26 = auVar56._0_8_;
                          auVar57 = auVar76._0_32_;
                          auVar56 = vpermd_avx512vl(auVar57,auVar59);
                          *(int *)(puVar26 + 1) = auVar56._0_4_;
                          auVar61 = valignd_avx512vl(auVar57,auVar57,1);
                          puVar26 = puVar26 + 2;
                          auVar76 = ZEXT3264(auVar61);
                          lVar23 = lVar23 + -1;
                        } while (lVar23 != 0);
                        auVar54 = vpermt2q_avx512vl(auVar54,auVar61,auVar55);
                        uVar31 = auVar54._0_8_;
                        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar80 = ZEXT1664(auVar53);
                        auVar81 = ZEXT3264(local_24f8);
                        auVar82 = ZEXT3264(local_2518);
                        auVar83 = ZEXT3264(local_2538);
                        auVar84 = ZEXT3264(local_2558);
                        auVar85 = ZEXT3264(local_2578);
                        auVar71 = ZEXT3264(auVar71._0_32_);
                        auVar72 = ZEXT3264(auVar72._0_32_);
                        auVar74 = ZEXT3264(auVar74._0_32_);
                        auVar75 = ZEXT3264(auVar75._0_32_);
                        auVar76 = ZEXT3264(auVar62);
                        auVar78 = ZEXT3264(auVar77);
                        auVar79 = ZEXT3264(auVar65);
                        auVar62 = vmovdqa64_avx512vl(auVar59);
                        in_ZMM16 = ZEXT3264(auVar62);
                        iVar19 = 0;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar19 = 6;
            }
          } while (iVar19 == 0);
        } while (iVar19 != 6);
        local_2600 = unaff_R12;
        local_2398 = vmovdqu64_avx512vl(in_ZMM16._0_32_);
        local_25f8 = (ulong)((uint)uVar31 & 0xf) - 8;
        if (local_25f8 != 0) {
          local_25f0 = 0;
          local_2620 = uVar31 & 0xfffffffffffffff0;
          do {
            local_2658 = local_25f0 * 0x140;
            uVar63 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar36._4_4_ = uVar63;
            auVar36._0_4_ = uVar63;
            auVar36._8_4_ = uVar63;
            auVar36._12_4_ = uVar63;
            auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2620 + 0x90 + local_2658),auVar36
                                      ,*(undefined1 (*) [16])(local_2620 + local_2658));
            auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2620 + 0xa0 + local_2658),auVar36
                                      ,*(undefined1 (*) [16])(local_2620 + 0x10 + local_2658));
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2620 + 0xb0 + local_2658),auVar36
                                      ,*(undefined1 (*) [16])(local_2620 + 0x20 + local_2658));
            auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2620 + 0xc0 + local_2658),auVar36
                                      ,*(undefined1 (*) [16])(local_2620 + 0x30 + local_2658));
            auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2620 + 0xd0 + local_2658),auVar36
                                      ,*(undefined1 (*) [16])(local_2620 + 0x40 + local_2658));
            auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2620 + 0xe0 + local_2658),auVar36
                                      ,*(undefined1 (*) [16])(local_2620 + 0x50 + local_2658));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2620 + 0xf0 + local_2658),auVar36
                                      ,*(undefined1 (*) [16])(local_2620 + 0x60 + local_2658));
            auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2620 + 0x100 + local_2658),
                                      auVar36,*(undefined1 (*) [16])(local_2620 + 0x70 + local_2658)
                                     );
            auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2620 + 0x110 + local_2658),
                                      auVar36,*(undefined1 (*) [16])(local_2620 + 0x80 + local_2658)
                                     );
            uVar63 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar43._4_4_ = uVar63;
            auVar43._0_4_ = uVar63;
            auVar43._8_4_ = uVar63;
            auVar43._12_4_ = uVar63;
            auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar63 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar68._4_4_ = uVar63;
            auVar68._0_4_ = uVar63;
            auVar68._8_4_ = uVar63;
            auVar68._12_4_ = uVar63;
            uVar63 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar69._4_4_ = uVar63;
            auVar69._0_4_ = uVar63;
            auVar69._8_4_ = uVar63;
            auVar69._12_4_ = uVar63;
            local_24a8 = &local_2661;
            fVar5 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar73._4_4_ = fVar5;
            auVar73._0_4_ = fVar5;
            auVar73._8_4_ = fVar5;
            auVar73._12_4_ = fVar5;
            auVar53 = vsubps_avx(auVar53,auVar43);
            auVar38 = vsubps_avx512vl(auVar52,auVar36);
            auVar39 = vsubps_avx512vl(auVar32,auVar37);
            auVar33 = vsubps_avx512vl(auVar33,auVar43);
            auVar34 = vsubps_avx512vl(auVar34,auVar36);
            auVar35 = vsubps_avx512vl(auVar35,auVar37);
            auVar40 = vsubps_avx512vl(auVar40,auVar43);
            auVar41 = vsubps_avx512vl(auVar41,auVar36);
            auVar42 = vsubps_avx512vl(auVar42,auVar37);
            auVar36 = vsubps_avx512vl(auVar40,auVar53);
            auVar52 = vsubps_avx(auVar41,auVar38);
            auVar37 = vsubps_avx512vl(auVar42,auVar39);
            auVar43 = vsubps_avx512vl(auVar53,auVar33);
            auVar44 = vsubps_avx512vl(auVar38,auVar34);
            auVar45 = vsubps_avx512vl(auVar39,auVar35);
            auVar46 = vsubps_avx512vl(auVar33,auVar40);
            auVar47 = vsubps_avx512vl(auVar34,auVar41);
            auVar48 = vsubps_avx512vl(auVar35,auVar42);
            auVar32 = vaddps_avx512vl(auVar40,auVar53);
            auVar70._0_4_ = auVar41._0_4_ + auVar38._0_4_;
            auVar70._4_4_ = auVar41._4_4_ + auVar38._4_4_;
            auVar70._8_4_ = auVar41._8_4_ + auVar38._8_4_;
            auVar70._12_4_ = auVar41._12_4_ + auVar38._12_4_;
            auVar49 = vaddps_avx512vl(auVar42,auVar39);
            auVar50 = vmulps_avx512vl(auVar70,auVar37);
            auVar50 = vfmsub231ps_avx512vl(auVar50,auVar52,auVar49);
            auVar49 = vmulps_avx512vl(auVar49,auVar36);
            auVar49 = vfmsub231ps_avx512vl(auVar49,auVar37,auVar32);
            auVar51._0_4_ = auVar52._0_4_ * auVar32._0_4_;
            auVar51._4_4_ = auVar52._4_4_ * auVar32._4_4_;
            auVar51._8_4_ = auVar52._8_4_ * auVar32._8_4_;
            auVar51._12_4_ = auVar52._12_4_ * auVar32._12_4_;
            auVar32 = vfmsub231ps_fma(auVar51,auVar36,auVar70);
            auVar66._0_4_ = fVar5 * auVar32._0_4_;
            auVar66._4_4_ = fVar5 * auVar32._4_4_;
            auVar66._8_4_ = fVar5 * auVar32._8_4_;
            auVar66._12_4_ = fVar5 * auVar32._12_4_;
            auVar32 = vfmadd231ps_avx512vl(auVar66,auVar69,auVar49);
            local_24d8 = vfmadd231ps_avx512vl(auVar32,auVar68,auVar50);
            auVar32 = vaddps_avx512vl(auVar53,auVar33);
            auVar49 = vaddps_avx512vl(auVar38,auVar34);
            auVar50 = vaddps_avx512vl(auVar39,auVar35);
            auVar51 = vmulps_avx512vl(auVar49,auVar45);
            auVar51 = vfmsub231ps_avx512vl(auVar51,auVar44,auVar50);
            auVar50 = vmulps_avx512vl(auVar50,auVar43);
            auVar50 = vfmsub231ps_avx512vl(auVar50,auVar45,auVar32);
            auVar32 = vmulps_avx512vl(auVar32,auVar44);
            auVar32 = vfmsub231ps_avx512vl(auVar32,auVar43,auVar49);
            auVar49._0_4_ = fVar5 * auVar32._0_4_;
            auVar49._4_4_ = fVar5 * auVar32._4_4_;
            auVar49._8_4_ = fVar5 * auVar32._8_4_;
            auVar49._12_4_ = fVar5 * auVar32._12_4_;
            auVar32 = vfmadd231ps_avx512vl(auVar49,auVar69,auVar50);
            local_24c8 = vfmadd231ps_avx512vl(auVar32,auVar68,auVar51);
            auVar32 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar64 = ZEXT1664(auVar32);
            auVar33 = vaddps_avx512vl(auVar33,auVar40);
            auVar34 = vaddps_avx512vl(auVar34,auVar41);
            auVar35 = vaddps_avx512vl(auVar35,auVar42);
            auVar40 = vmulps_avx512vl(auVar34,auVar48);
            auVar40 = vfmsub231ps_avx512vl(auVar40,auVar47,auVar35);
            auVar35 = vmulps_avx512vl(auVar35,auVar46);
            auVar35 = vfmsub231ps_avx512vl(auVar35,auVar48,auVar33);
            auVar33 = vmulps_avx512vl(auVar33,auVar47);
            auVar33 = vfmsub231ps_avx512vl(auVar33,auVar46,auVar34);
            auVar33 = vmulps_avx512vl(auVar73,auVar33);
            auVar33 = vfmadd231ps_avx512vl(auVar33,auVar69,auVar35);
            auVar33 = vfmadd231ps_avx512vl(auVar33,auVar68,auVar40);
            auVar50._0_4_ = local_24c8._0_4_ + local_24d8._0_4_;
            auVar50._4_4_ = local_24c8._4_4_ + local_24d8._4_4_;
            auVar50._8_4_ = local_24c8._8_4_ + local_24d8._8_4_;
            auVar50._12_4_ = local_24c8._12_4_ + local_24d8._12_4_;
            local_24b8 = vaddps_avx512vl(auVar33,auVar50);
            auVar41._8_4_ = 0x7fffffff;
            auVar41._0_8_ = 0x7fffffff7fffffff;
            auVar41._12_4_ = 0x7fffffff;
            auVar34 = vandps_avx512vl(local_24b8,auVar41);
            auVar42._8_4_ = 0x34000000;
            auVar42._0_8_ = 0x3400000034000000;
            auVar42._12_4_ = 0x34000000;
            auVar35 = vmulps_avx512vl(auVar34,auVar42);
            auVar40 = vminps_avx512vl(local_24d8,local_24c8);
            auVar40 = vminps_avx512vl(auVar40,auVar33);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar41 = vxorps_avx512vl(auVar35,auVar41);
            uVar15 = vcmpps_avx512vl(auVar40,auVar41,5);
            auVar40 = vmaxps_avx512vl(local_24d8,local_24c8);
            auVar33 = vmaxps_avx512vl(auVar40,auVar33);
            uVar13 = vcmpps_avx512vl(auVar33,auVar35,2);
            local_24a0 = ((byte)uVar15 | (byte)uVar13) & 0xf;
            if (local_24a0 != 0) {
              auVar33 = vmulps_avx512vl(auVar37,auVar44);
              auVar35 = vmulps_avx512vl(auVar36,auVar45);
              auVar40 = vmulps_avx512vl(auVar52,auVar43);
              auVar41 = vmulps_avx512vl(auVar45,auVar47);
              auVar42 = vmulps_avx512vl(auVar43,auVar48);
              auVar49 = vmulps_avx512vl(auVar44,auVar46);
              auVar52 = vfmsub213ps_avx512vl(auVar52,auVar45,auVar33);
              auVar37 = vfmsub213ps_avx512vl(auVar37,auVar43,auVar35);
              auVar36 = vfmsub213ps_avx512vl(auVar36,auVar44,auVar40);
              auVar44 = vfmsub213ps_avx512vl(auVar48,auVar44,auVar41);
              auVar45 = vfmsub213ps_avx512vl(auVar46,auVar45,auVar42);
              auVar43 = vfmsub213ps_avx512vl(auVar47,auVar43,auVar49);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar33 = vandps_avx512vl(auVar33,auVar46);
              auVar41 = vandps_avx512vl(auVar41,auVar46);
              uVar24 = vcmpps_avx512vl(auVar33,auVar41,1);
              auVar33 = vandps_avx512vl(auVar35,auVar46);
              auVar35 = vandps_avx512vl(auVar42,auVar46);
              uVar21 = vcmpps_avx512vl(auVar33,auVar35,1);
              auVar33 = vandps_avx512vl(auVar40,auVar46);
              auVar35 = vandps_avx512vl(auVar49,auVar46);
              uVar31 = vcmpps_avx512vl(auVar33,auVar35,1);
              bVar11 = (bool)((byte)uVar24 & 1);
              local_2468._0_4_ = (uint)bVar11 * auVar52._0_4_ | (uint)!bVar11 * auVar44._0_4_;
              bVar11 = (bool)((byte)(uVar24 >> 1) & 1);
              local_2468._4_4_ = (uint)bVar11 * auVar52._4_4_ | (uint)!bVar11 * auVar44._4_4_;
              bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
              local_2468._8_4_ = (uint)bVar11 * auVar52._8_4_ | (uint)!bVar11 * auVar44._8_4_;
              bVar11 = (bool)((byte)(uVar24 >> 3) & 1);
              local_2468._12_4_ = (uint)bVar11 * auVar52._12_4_ | (uint)!bVar11 * auVar44._12_4_;
              bVar11 = (bool)((byte)uVar21 & 1);
              local_2458._0_4_ = (uint)bVar11 * auVar37._0_4_ | (uint)!bVar11 * auVar45._0_4_;
              bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
              local_2458._4_4_ = (uint)bVar11 * auVar37._4_4_ | (uint)!bVar11 * auVar45._4_4_;
              bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
              local_2458._8_4_ = (uint)bVar11 * auVar37._8_4_ | (uint)!bVar11 * auVar45._8_4_;
              bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
              local_2458._12_4_ = (uint)bVar11 * auVar37._12_4_ | (uint)!bVar11 * auVar45._12_4_;
              bVar11 = (bool)((byte)uVar31 & 1);
              local_2448[0] = (float)((uint)bVar11 * auVar36._0_4_ | (uint)!bVar11 * auVar43._0_4_);
              bVar11 = (bool)((byte)(uVar31 >> 1) & 1);
              local_2448[1] = (float)((uint)bVar11 * auVar36._4_4_ | (uint)!bVar11 * auVar43._4_4_);
              bVar11 = (bool)((byte)(uVar31 >> 2) & 1);
              local_2448[2] = (float)((uint)bVar11 * auVar36._8_4_ | (uint)!bVar11 * auVar43._8_4_);
              bVar11 = (bool)((byte)(uVar31 >> 3) & 1);
              local_2448[3] =
                   (float)((uint)bVar11 * auVar36._12_4_ | (uint)!bVar11 * auVar43._12_4_);
              auVar46._0_4_ = fVar5 * local_2448[0];
              auVar46._4_4_ = fVar5 * local_2448[1];
              auVar46._8_4_ = fVar5 * local_2448[2];
              auVar46._12_4_ = fVar5 * local_2448[3];
              auVar52 = vfmadd213ps_fma(auVar69,local_2458,auVar46);
              auVar52 = vfmadd213ps_fma(auVar68,local_2468,auVar52);
              auVar44._0_4_ = auVar52._0_4_ + auVar52._0_4_;
              auVar44._4_4_ = auVar52._4_4_ + auVar52._4_4_;
              auVar44._8_4_ = auVar52._8_4_ + auVar52._8_4_;
              auVar44._12_4_ = auVar52._12_4_ + auVar52._12_4_;
              auVar45._0_4_ = auVar39._0_4_ * local_2448[0];
              auVar45._4_4_ = auVar39._4_4_ * local_2448[1];
              auVar45._8_4_ = auVar39._8_4_ * local_2448[2];
              auVar45._12_4_ = auVar39._12_4_ * local_2448[3];
              auVar52 = vfmadd213ps_fma(auVar38,local_2458,auVar45);
              auVar52 = vfmadd213ps_fma(auVar53,local_2468,auVar52);
              auVar53 = vrcp14ps_avx512vl(auVar44);
              auVar35 = auVar80._0_16_;
              auVar33 = vfnmadd213ps_avx512vl(auVar53,auVar44,auVar35);
              auVar53 = vfmadd132ps_fma(auVar33,auVar53,auVar53);
              local_2478._0_4_ = (auVar52._0_4_ + auVar52._0_4_) * auVar53._0_4_;
              local_2478._4_4_ = (auVar52._4_4_ + auVar52._4_4_) * auVar53._4_4_;
              local_2478._8_4_ = (auVar52._8_4_ + auVar52._8_4_) * auVar53._8_4_;
              local_2478._12_4_ = (auVar52._12_4_ + auVar52._12_4_) * auVar53._12_4_;
              auVar71 = ZEXT1664(local_2478);
              uVar63 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar53._4_4_ = uVar63;
              auVar53._0_4_ = uVar63;
              auVar53._8_4_ = uVar63;
              auVar53._12_4_ = uVar63;
              uVar15 = vcmpps_avx512vl(local_2478,auVar53,0xd);
              uVar24 = CONCAT44(auVar44._4_4_,auVar44._0_4_);
              auVar37._0_8_ = uVar24 ^ 0x8000000080000000;
              auVar37._8_4_ = -auVar44._8_4_;
              auVar37._12_4_ = -auVar44._12_4_;
              fVar5 = (ray->super_RayK<1>).tfar;
              auVar52._4_4_ = fVar5;
              auVar52._0_4_ = fVar5;
              auVar52._8_4_ = fVar5;
              auVar52._12_4_ = fVar5;
              uVar13 = vcmpps_avx512vl(local_2478,auVar52,2);
              uVar14 = vcmpps_avx512vl(auVar44,auVar37,4);
              local_24a0 = (byte)uVar15 & (byte)uVar13 & (byte)uVar14 & local_24a0;
              uVar30 = (uint)local_24a0;
              if (local_24a0 != 0) {
                local_2658 = local_2658 + local_2620;
                local_24a8 = &local_2661;
                auVar38._8_4_ = 0x219392ef;
                auVar38._0_8_ = 0x219392ef219392ef;
                auVar38._12_4_ = 0x219392ef;
                uVar24 = vcmpps_avx512vl(auVar34,auVar38,5);
                auVar53 = vrcp14ps_avx512vl(local_24b8);
                auVar52 = vfnmadd213ps_avx512vl(local_24b8,auVar53,auVar35);
                auVar53 = vfmadd132ps_avx512vl(auVar52,auVar53,auVar53);
                fVar1 = (float)((uint)((byte)uVar24 & 1) * auVar53._0_4_);
                fVar5 = (float)((uint)((byte)(uVar24 >> 1) & 1) * auVar53._4_4_);
                fVar2 = (float)((uint)((byte)(uVar24 >> 2) & 1) * auVar53._8_4_);
                fVar3 = (float)((uint)((byte)(uVar24 >> 3) & 1) * auVar53._12_4_);
                auVar47._0_4_ = fVar1 * local_24d8._0_4_;
                auVar47._4_4_ = fVar5 * local_24d8._4_4_;
                auVar47._8_4_ = fVar2 * local_24d8._8_4_;
                auVar47._12_4_ = fVar3 * local_24d8._12_4_;
                local_2498 = vminps_avx512vl(auVar47,auVar35);
                auVar48._0_4_ = fVar1 * local_24c8._0_4_;
                auVar48._4_4_ = fVar5 * local_24c8._4_4_;
                auVar48._8_4_ = fVar2 * local_24c8._8_4_;
                auVar48._12_4_ = fVar3 * local_24c8._12_4_;
                local_2488 = vminps_avx512vl(auVar48,auVar35);
                pSVar7 = context->scene;
                auVar53 = vblendmps_avx512vl(auVar32,local_2478);
                auVar39._0_4_ =
                     (uint)(local_24a0 & 1) * auVar53._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * local_2488._0_4_;
                bVar11 = (bool)(local_24a0 >> 1 & 1);
                auVar39._4_4_ = (uint)bVar11 * auVar53._4_4_ | (uint)!bVar11 * local_2488._4_4_;
                bVar11 = (bool)(local_24a0 >> 2 & 1);
                auVar39._8_4_ = (uint)bVar11 * auVar53._8_4_ | (uint)!bVar11 * local_2488._8_4_;
                auVar39._12_4_ =
                     (uint)(local_24a0 >> 3) * auVar53._12_4_ |
                     (uint)!(bool)(local_24a0 >> 3) * local_2488._12_4_;
                auVar53 = vshufps_avx(auVar39,auVar39,0xb1);
                auVar53 = vminps_avx(auVar53,auVar39);
                auVar52 = vshufpd_avx(auVar53,auVar53,1);
                auVar53 = vminps_avx(auVar52,auVar53);
                uVar15 = vcmpps_avx512vl(auVar39,auVar53,0);
                bVar18 = (byte)uVar15 & local_24a0;
                if (((byte)uVar15 & local_24a0) == 0) {
                  bVar18 = local_24a0;
                }
                uVar24 = 0;
                for (uVar21 = (ulong)bVar18; (uVar21 & 1) == 0;
                    uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                  uVar24 = uVar24 + 1;
                }
                do {
                  uVar22 = *(uint *)(local_2658 + 0x120 + uVar24 * 4);
                  pGVar8 = (pSVar7->geometries).items[uVar22].ptr;
                  auVar53 = auVar39;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
                    bVar18 = ~(byte)(1 << ((uint)uVar24 & 0x1f)) & (byte)uVar30;
LAB_01fc3a60:
                    uVar30 = (uint)bVar18;
                    bVar11 = true;
                  }
                  else {
                    pRVar9 = context->args;
                    if ((pRVar9->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_25e8.context = context->user;
                      local_25b8 = *(float *)(local_2468 + uVar24 * 4);
                      local_25b4 = local_2448[uVar24 - 4];
                      local_25b0 = local_2448[uVar24];
                      local_25ac = *(undefined4 *)(local_2498 + uVar24 * 4);
                      local_25a8 = *(undefined4 *)(local_2488 + uVar24 * 4);
                      local_25a4 = *(undefined4 *)(local_2658 + 0x130 + uVar24 * 4);
                      local_25a0 = uVar22;
                      local_259c = (local_25e8.context)->instID[0];
                      local_2598 = (local_25e8.context)->instPrimID[0];
                      local_2628 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_2478 + uVar24 * 4);
                      local_2624 = -1;
                      local_25e8.valid = &local_2624;
                      local_25e8.geometryUserPtr = pGVar8->userPtr;
                      local_25e8.ray = (RTCRayN *)ray;
                      local_25e8.hit = (RTCHitN *)&local_25b8;
                      local_25e8.N = 1;
                      local_2588 = auVar71._0_16_;
                      if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01fc3c56:
                        if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar9->filter)(&local_25e8);
                            auVar71 = ZEXT1664(local_2588);
                            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            auVar64 = ZEXT1664(auVar53);
                            auVar85 = ZEXT3264(local_2578);
                            auVar84 = ZEXT3264(local_2558);
                            auVar83 = ZEXT3264(local_2538);
                            auVar82 = ZEXT3264(local_2518);
                            auVar81 = ZEXT3264(local_24f8);
                            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar80 = ZEXT1664(auVar53);
                            context = local_2630;
                            ray = local_2638;
                            uVar25 = local_2660;
                            uVar27 = local_2640;
                            uVar28 = local_2648;
                            uVar29 = local_2650;
                          }
                          if (*local_25e8.valid == 0) goto LAB_01fc3d67;
                        }
                        (((Vec3f *)((long)local_25e8.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_25e8.hit;
                        (((Vec3f *)((long)local_25e8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_25e8.hit + 4);
                        (((Vec3f *)((long)local_25e8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_25e8.hit + 8);
                        *(float *)((long)local_25e8.ray + 0x3c) = *(float *)(local_25e8.hit + 0xc);
                        local_2628 = *(float *)(local_25e8.hit + 0x10);
                        *(float *)((long)local_25e8.ray + 0x40) = local_2628;
                        *(float *)((long)local_25e8.ray + 0x44) = *(float *)(local_25e8.hit + 0x14);
                        *(float *)((long)local_25e8.ray + 0x48) = *(float *)(local_25e8.hit + 0x18);
                        *(float *)((long)local_25e8.ray + 0x4c) = *(float *)(local_25e8.hit + 0x1c);
                        *(float *)((long)local_25e8.ray + 0x50) = *(float *)(local_25e8.hit + 0x20);
                        uVar25 = local_2660;
                      }
                      else {
                        local_2618 = puVar26;
                        (*pGVar8->intersectionFilterN)(&local_25e8);
                        auVar71 = ZEXT1664(local_2588);
                        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        auVar64 = ZEXT1664(auVar53);
                        auVar85 = ZEXT3264(local_2578);
                        auVar84 = ZEXT3264(local_2558);
                        auVar83 = ZEXT3264(local_2538);
                        auVar82 = ZEXT3264(local_2518);
                        auVar81 = ZEXT3264(local_24f8);
                        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar80 = ZEXT1664(auVar53);
                        context = local_2630;
                        ray = local_2638;
                        uVar25 = local_2660;
                        puVar26 = local_2618;
                        uVar27 = local_2640;
                        uVar28 = local_2648;
                        uVar29 = local_2650;
                        if (*local_25e8.valid != 0) goto LAB_01fc3c56;
LAB_01fc3d67:
                        (ray->super_RayK<1>).tfar = local_2628;
                      }
                      fVar5 = (ray->super_RayK<1>).tfar;
                      auVar17._4_4_ = fVar5;
                      auVar17._0_4_ = fVar5;
                      auVar17._8_4_ = fVar5;
                      auVar17._12_4_ = fVar5;
                      uVar15 = vcmpps_avx512vl(auVar71._0_16_,auVar17,2);
                      bVar18 = ~(byte)(1 << ((uint)uVar24 & 0x1f)) & (byte)uVar30 & (byte)uVar15;
                      auVar53 = ZEXT416((uint)local_2628);
                      goto LAB_01fc3a60;
                    }
                    bVar11 = false;
                  }
                  if (!bVar11) {
                    fVar5 = *(float *)(local_2498 + uVar24 * 4);
                    fVar2 = *(float *)(local_2488 + uVar24 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2478 + uVar24 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_2468 + uVar24 * 4);
                    (ray->Ng).field_0.field_0.y = local_2448[uVar24 - 4];
                    (ray->Ng).field_0.field_0.z = local_2448[uVar24];
                    ray->u = fVar5;
                    ray->v = fVar2;
                    ray->primID = *(uint *)(local_2658 + 0x130 + uVar24 * 4);
                    ray->geomID = uVar22;
                    pRVar10 = context->user;
                    ray->instID[0] = pRVar10->instID[0];
                    ray->instPrimID[0] = pRVar10->instPrimID[0];
                    break;
                  }
                  bVar18 = (byte)uVar30;
                  if (bVar18 == 0) break;
                  auVar52 = vblendmps_avx512vl(auVar64._0_16_,auVar71._0_16_);
                  auVar39._0_4_ =
                       (uint)(bVar18 & 1) * auVar52._0_4_ |
                       (uint)!(bool)(bVar18 & 1) * auVar53._0_4_;
                  bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
                  auVar39._4_4_ = (uint)bVar11 * auVar52._4_4_ | (uint)!bVar11 * auVar53._4_4_;
                  bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
                  auVar39._8_4_ = (uint)bVar11 * auVar52._8_4_ | (uint)!bVar11 * auVar53._8_4_;
                  auVar39._12_4_ =
                       (uVar30 >> 3) * auVar52._12_4_ | (uint)!SUB41(uVar30 >> 3,0) * auVar53._12_4_
                  ;
                  auVar53 = vshufps_avx(auVar39,auVar39,0xb1);
                  auVar53 = vminps_avx(auVar53,auVar39);
                  auVar52 = vshufpd_avx(auVar53,auVar53,1);
                  auVar53 = vminps_avx(auVar52,auVar53);
                  uVar15 = vcmpps_avx512vl(auVar39,auVar53,0);
                  bVar18 = (byte)uVar15 & bVar18;
                  uVar22 = uVar30;
                  if (bVar18 != 0) {
                    uVar22 = (uint)bVar18;
                  }
                  uVar16 = 0;
                  for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
                    uVar16 = uVar16 + 1;
                  }
                  uVar24 = (ulong)uVar16;
                } while( true );
              }
            }
            local_25f0 = local_25f0 + 1;
          } while (local_25f0 != local_25f8);
        }
        fVar5 = (ray->super_RayK<1>).tfar;
        auVar64 = ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416(fVar5,CONCAT412
                                                  (fVar5,CONCAT48(fVar5,CONCAT44(fVar5,fVar5))))))))
        ;
        auVar71 = ZEXT3264(local_23b8);
        auVar72 = ZEXT3264(local_23d8);
        auVar74 = ZEXT3264(local_23f8);
        auVar75 = ZEXT3264(local_2418);
        auVar76 = ZEXT3264(local_2438);
        auVar62 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar78 = ZEXT3264(auVar62);
        auVar79 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        auVar62 = vmovdqu64_avx512vl(local_2398);
        in_ZMM16 = ZEXT3264(auVar62);
        uVar24 = local_2608;
        unaff_R12 = local_2600;
        uVar21 = local_2610;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }